

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alias.c
# Opt level: O0

void do_unalias(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *in_RDI;
  bool found;
  int pos;
  char arg [4608];
  CHAR_DATA *rch;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  uint3 in_stack_ffffffffffffede0;
  uint uVar3;
  undefined4 in_stack_ffffffffffffede4;
  int iVar4;
  CHAR_DATA *in_stack_ffffffffffffede8;
  char *in_stack_ffffffffffffedf0;
  CHAR_DATA *local_18;
  
  uVar3 = (uint)in_stack_ffffffffffffede0;
  local_18 = in_RDI;
  if ((in_RDI->desc != (DESCRIPTOR_DATA *)0x0) &&
     (in_stack_ffffffffffffedd8 = in_RDI, in_RDI->desc->original != (CHAR_DATA *)0x0)) {
    local_18 = in_RDI->desc->original;
    in_stack_ffffffffffffedd8 = local_18;
  }
  bVar1 = is_npc(in_stack_ffffffffffffedd8);
  if (!bVar1) {
    one_argument((char *)CONCAT44(in_stack_ffffffffffffede4,uVar3),(char *)in_stack_ffffffffffffedd8
                );
    for (iVar4 = 0; (iVar4 < 10 && (local_18->pcdata->alias[iVar4] != (char *)0x0));
        iVar4 = iVar4 + 1) {
      if ((uVar3 & 0x1000000) == 0) {
        iVar2 = strcmp(&stack0xffffffffffffede8,local_18->pcdata->alias[iVar4]);
        if (iVar2 == 0) {
          send_to_char(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
          free_pstring((char *)CONCAT44(iVar4,uVar3));
          free_pstring((char *)CONCAT44(iVar4,uVar3));
          local_18->pcdata->alias[iVar4] = (char *)0x0;
          local_18->pcdata->alias_sub[iVar4] = (char *)0x0;
          uVar3 = CONCAT13(1,(int3)uVar3);
        }
      }
      else {
        local_18->pcdata->alias[iVar4 + -1] = local_18->pcdata->alias[iVar4];
        local_18->pcdata->alias_sub[iVar4 + -1] = local_18->pcdata->alias_sub[iVar4];
        local_18->pcdata->alias[iVar4] = (char *)0x0;
        local_18->pcdata->alias_sub[iVar4] = (char *)0x0;
      }
    }
    if ((uVar3 & 0x1000000) == 0) {
      send_to_char(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
    }
  }
  return;
}

Assistant:

void do_unalias(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *rch;
	char arg[MAX_INPUT_LENGTH];
	int pos;
	bool found = false;

	if (ch->desc == nullptr)
		rch = ch;
	else
		rch = ch->desc->original ? ch->desc->original : ch;

	if (is_npc(rch))
		return;

	argument = one_argument(argument, arg);

	if (arg == (char *)'\0')
	{
		send_to_char("Unalias what?\n\r", ch);
		return;
	}

	for (pos = 0; pos < MAX_ALIAS; pos++)
	{
		if (rch->pcdata->alias[pos] == nullptr)
			break;

		if (found)
		{

			rch->pcdata->alias[pos - 1] = rch->pcdata->alias[pos];
			rch->pcdata->alias_sub[pos - 1] = rch->pcdata->alias_sub[pos];
			rch->pcdata->alias[pos] = nullptr;
			rch->pcdata->alias_sub[pos] = nullptr;
			continue;
		}

		if (!strcmp(arg, rch->pcdata->alias[pos]))
		{
			send_to_char("Alias removed.\n\r", ch);

			free_pstring(rch->pcdata->alias[pos]);
			free_pstring(rch->pcdata->alias_sub[pos]);
			rch->pcdata->alias[pos] = nullptr;
			rch->pcdata->alias_sub[pos] = nullptr;

			found = true;
		}
	}

	if (!found)
		send_to_char("No alias of that name to remove.\n\r", ch);
}